

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswAig.c
# Opt level: O2

Aig_Man_t * Ssw_FramesWithClasses(Ssw_Man_t *p)

{
  Vec_Int_t *pVVar1;
  Aig_Man_t *pAVar2;
  void *pvVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *p1;
  Aig_Man_t *pAVar6;
  void *pvVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int i;
  
  if (p->pFrames != (Aig_Man_t *)0x0) {
    __assert_fail("p->pFrames == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswAig.c"
                  ,0x95,"Aig_Man_t *Ssw_FramesWithClasses(Ssw_Man_t *)");
  }
  pAVar2 = p->pAig;
  if (pAVar2->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(p->pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswAig.c"
                  ,0x96,"Aig_Man_t *Ssw_FramesWithClasses(Ssw_Man_t *)");
  }
  if (pAVar2->nObjs[2] <= pAVar2->nRegs) {
    __assert_fail("Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswAig.c"
                  ,0x97,"Aig_Man_t *Ssw_FramesWithClasses(Ssw_Man_t *)");
  }
  p->nConstrTotal = 0;
  p->nConstrReduced = 0;
  pAVar2 = Aig_ManStart(p->nFrames * pAVar2->vObjs->nSize);
  for (iVar9 = 0; pAVar6 = p->pAig, iVar9 < pAVar6->nRegs; iVar9 = iVar9 + 1) {
    pvVar3 = Vec_PtrEntry(pAVar6->vCis,pAVar6->nTruePis + iVar9);
    pAVar4 = Aig_ObjCreateCi(pAVar2);
    p->pNodeToFrames[(long)*(int *)((long)pvVar3 + 0x24) * (long)p->nFrames] = pAVar4;
  }
  uVar10 = 0;
  iVar9 = 0;
  while (i = iVar9, i < p->pPars->nFramesK) {
    p->pNodeToFrames[pAVar6->pConst1->Id * p->nFrames + i] = pAVar2->pConst1;
    iVar9 = 0;
    while( true ) {
      pAVar6 = p->pAig;
      iVar11 = (int)uVar10;
      if (pAVar6->nTruePis <= iVar9) break;
      pvVar3 = Vec_PtrEntry(pAVar6->vCis,iVar9);
      pAVar4 = Aig_ObjCreateCi(pAVar2);
      pVVar1 = p->vInits;
      if (pVVar1 == (Vec_Int_t *)0x0) {
        uVar8 = 0;
      }
      else {
        if ((iVar11 < 0) || (pVVar1->nSize <= iVar11)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar8 = (ulong)(pVVar1->pArray[uVar10] != 0) << 3;
        uVar10 = (ulong)(iVar11 + 1);
      }
      *(ulong *)&pAVar4->field_0x18 = *(ulong *)&pAVar4->field_0x18 & 0xfffffffffffffff7 | uVar8;
      p->pNodeToFrames[*(int *)((long)pvVar3 + 0x24) * p->nFrames + i] = pAVar4;
      iVar9 = iVar9 + 1;
    }
    for (iVar9 = 0; iVar9 < pAVar6->nRegs; iVar9 = iVar9 + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAVar6->vCis,pAVar6->nTruePis + iVar9);
      Ssw_FramesConstrainNode(p,pAVar2,p->pAig,pAVar4,i,1);
      pAVar6 = p->pAig;
    }
    for (iVar9 = 0; iVar9 < pAVar6->vObjs->nSize; iVar9 = iVar9 + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAVar6->vObjs,iVar9);
      if ((pAVar4 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar4->field_0x18 & 7) - 7)) {
        pAVar5 = Ssw_ObjChild0Fra(p,pAVar4,i);
        p1 = Ssw_ObjChild1Fra(p,pAVar4,i);
        pAVar5 = Aig_And(pAVar2,pAVar5,p1);
        p->pNodeToFrames[pAVar4->Id * p->nFrames + i] = pAVar5;
        Ssw_FramesConstrainNode(p,pAVar2,p->pAig,pAVar4,i,1);
      }
      pAVar6 = p->pAig;
    }
    for (iVar9 = 0; iVar9 < pAVar6->vCos->nSize; iVar9 = iVar9 + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAVar6->vCos,iVar9);
      pAVar5 = Ssw_ObjChild0Fra(p,pAVar4,i);
      p->pNodeToFrames[pAVar4->Id * p->nFrames + i] = pAVar5;
      pAVar6 = p->pAig;
    }
    for (iVar11 = 0; iVar9 = i + 1, iVar11 < pAVar6->nRegs; iVar11 = iVar11 + 1) {
      pvVar3 = Vec_PtrEntry(pAVar6->vCos,pAVar6->nTruePos + iVar11);
      pvVar7 = Vec_PtrEntry(p->pAig->vCis,p->pAig->nTruePis + iVar11);
      p->pNodeToFrames[p->nFrames * *(int *)((long)pvVar7 + 0x24) + i + 1] =
           p->pNodeToFrames[*(int *)((long)pvVar3 + 0x24) * p->nFrames + i];
      pAVar6 = p->pAig;
    }
  }
  if ((p->vInits != (Vec_Int_t *)0x0) && (p->vInits->nSize != (int)uVar10 + pAVar6->nTruePis)) {
    __assert_fail("p->vInits == NULL || Vec_IntSize(p->vInits) == iLits + Saig_ManPiNum(p->pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswAig.c"
                  ,0xbc,"Aig_Man_t *Ssw_FramesWithClasses(Ssw_Man_t *)");
  }
  for (iVar9 = 0; iVar9 < pAVar6->nRegs; iVar9 = iVar9 + 1) {
    pvVar3 = Vec_PtrEntry(pAVar6->vCis,pAVar6->nTruePis + iVar9);
    Aig_ObjCreateCo(pAVar2,p->pNodeToFrames
                           [(long)*(int *)((long)pvVar3 + 0x24) * (long)p->nFrames +
                            (long)p->pPars->nFramesK]);
    pAVar6 = p->pAig;
  }
  Aig_ManCleanup(pAVar2);
  if (pAVar2->pData != (void *)0x0) {
    __assert_fail("pFrames->pData == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswAig.c"
                  ,0xc4,"Aig_Man_t *Ssw_FramesWithClasses(Ssw_Man_t *)");
  }
  return pAVar2;
}

Assistant:

Aig_Man_t * Ssw_FramesWithClasses( Ssw_Man_t * p )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pObjNew;
    int i, f, iLits;
    assert( p->pFrames == NULL );
    assert( Aig_ManRegNum(p->pAig) > 0 );
    assert( Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig) );
    p->nConstrTotal = p->nConstrReduced = 0;

    // start the fraig package
    pFrames = Aig_ManStart( Aig_ManObjNumMax(p->pAig) * p->nFrames );
    // create latches for the first frame
    Saig_ManForEachLo( p->pAig, pObj, i )
        Ssw_ObjSetFrame( p, pObj, 0, Aig_ObjCreateCi(pFrames) );
    // add timeframes
    iLits = 0;
    for ( f = 0; f < p->pPars->nFramesK; f++ )
    {
        // map constants and PIs
        Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), f, Aig_ManConst1(pFrames) );
        Saig_ManForEachPi( p->pAig, pObj, i )
        {
            pObjNew = Aig_ObjCreateCi(pFrames);
            pObjNew->fPhase = (p->vInits != NULL) && Vec_IntEntry(p->vInits, iLits++);
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
        }
        // set the constraints on the latch outputs
        Saig_ManForEachLo( p->pAig, pObj, i )
            Ssw_FramesConstrainNode( p, pFrames, p->pAig, pObj, f, 1 );
        // add internal nodes of this frame
        Aig_ManForEachNode( p->pAig, pObj, i )
        {
            pObjNew = Aig_And( pFrames, Ssw_ObjChild0Fra(p, pObj, f), Ssw_ObjChild1Fra(p, pObj, f) );
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
            Ssw_FramesConstrainNode( p, pFrames, p->pAig, pObj, f, 1 );
        }
        // transfer to the primary outputs
        Aig_ManForEachCo( p->pAig, pObj, i )
            Ssw_ObjSetFrame( p, pObj, f, Ssw_ObjChild0Fra(p, pObj,f) );
        // transfer latch input to the latch outputs
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
            Ssw_ObjSetFrame( p, pObjLo, f+1, Ssw_ObjFrame(p, pObjLi,f) );
    }
    assert( p->vInits == NULL || Vec_IntSize(p->vInits) == iLits + Saig_ManPiNum(p->pAig) );
    // add the POs for the latch outputs of the last frame
    Saig_ManForEachLo( p->pAig, pObj, i )
        Aig_ObjCreateCo( pFrames, Ssw_ObjFrame( p, pObj, p->pPars->nFramesK ) );

    // remove dangling nodes
    Aig_ManCleanup( pFrames );
    // make sure the satisfying assignment is node assigned
    assert( pFrames->pData == NULL );
//Aig_ManShow( pFrames, 0, NULL );
    return pFrames;
}